

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

libcaption_stauts_t sei_from_caption_clear(sei_t *sei)

{
  uint16_t uVar1;
  cea708_t cea708;
  itu_t_t35_country_code_t in_stack_ffffffffffffff58;
  itu_t_t35_provider_code_t in_stack_ffffffffffffff5c;
  eia608_control_t in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  cea708_t *in_stack_ffffffffffffff68;
  sei_t *in_stack_ffffffffffffff70;
  
  cea708_init((cea708_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              (double)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  cea708_add_cc_data((cea708_t *)&stack0xffffffffffffff58,1,cc_type_ntsc_cc_field_1,uVar1);
  sei_append_708(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t sei_from_caption_clear(sei_t* sei)
{
    cea708_t cea708;
    cea708_init(&cea708, sei->timestamp); // set up a new popon frame
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_display_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_display_memory, DEFAULT_CHANNEL));
    sei_append_708(sei, &cea708);
    return LIBCAPTION_OK;
}